

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteArray.cpp
# Opt level: O2

bool __thiscall ByteArray::toFile(ByteArray *this,path *fileName)

{
  char cVar1;
  bool bVar2;
  ofstream stream;
  
  ghc::filesystem::basic_ofstream<char,_std::char_traits<char>_>::basic_ofstream
            (&stream,fileName,_S_trunc|_S_out|_S_bin);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    bVar2 = false;
  }
  else {
    std::ostream::write((char *)&stream,(long)this->data_);
    bVar2 = ((&stream.super_basic_ofstream<char,_std::char_traits<char>_>.
               super_basic_ostream<char,_std::char_traits<char>_>.field_0x20)
             [(long)stream.super_basic_ofstream<char,_std::char_traits<char>_>.
                    super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream[-3]] & 5)
            == 0;
  }
  ghc::filesystem::basic_ofstream<char,_std::char_traits<char>_>::~basic_ofstream(&stream);
  return bVar2;
}

Assistant:

bool ByteArray::toFile(const fs::path& fileName)
{
	fs::ofstream stream(fileName, fs::fstream::out | fs::fstream::binary | fs::fstream::trunc);
	if (!stream.is_open())
		return {};

	stream.write(reinterpret_cast<const char *>(data_), size_);
	return !stream.fail();
}